

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputCaseLabel(Node *this,ostream *os)

{
  ostream *poVar1;
  undefined1 local_68 [48];
  undefined1 local_38 [40];
  ostream *os_local;
  Node *this_local;
  
  local_38._32_8_ = os;
  os_local = (ostream *)this;
  if (this->Type == 0x1f5) {
    OutputCaseLabel(this->Tree[0],os);
    OutputCaseLabel(this->Tree[1],(ostream *)local_38._32_8_);
  }
  else {
    Indent_abi_cxx11_((Node *)local_38);
    poVar1 = std::operator<<(os,(string *)local_38);
    poVar1 = std::operator<<(poVar1,"case ");
    Expression_abi_cxx11_((Node *)local_68);
    poVar1 = std::operator<<(poVar1,(string *)local_68);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void Node::OutputCaseLabel(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	//
	// Handle this if it is a list
	//
	if (Type == BAS_N_LIST)
	{
		Tree[0]->OutputCaseLabel(os);
		Tree[1]->OutputCaseLabel(os);
		return;
	}

	//
	// Output one case statement
	//
	os << Indent() << "case " << Expression() << ":" << std::endl;
}